

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
     texture_gather_offset_sampler_2d_array(NegativeTestContext *ctx)

{
  ShaderType shaderType;
  bool bVar1;
  char *__s;
  long lVar2;
  DataType in_stack_fffffffffffffd78;
  DataType in_stack_fffffffffffffd80;
  allocator<char> local_279;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"textureGatherOffset - sampler2DArray",
             (allocator<char> *)&local_250);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar2);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,__s,&local_279);
      std::operator+(&shaderSource,"Verify shader: ",&local_250);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_250);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x2b,FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,TYPE_INT_VEC2,
                 in_stack_fffffffffffffd78,in_stack_fffffffffffffd80);
      std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x2b,FUNCTION_TEXTURE_GATHER_OFFSET_MODE_LAST|
                       FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,TYPE_INT,in_stack_fffffffffffffd78,
                 in_stack_fffffffffffffd80);
      std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x2b,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_INT,in_stack_fffffffffffffd78
                );
      std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x2b,TYPE_FLOAT_VEC3,TYPE_INT,TYPE_INT,in_stack_fffffffffffffd78
                );
      std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x2b,TYPE_FLOAT_VEC3,TYPE_INT,TYPE_FLOAT,
                 in_stack_fffffffffffffd78);
      std::__cxx11::string::string((string *)&local_d0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x38,FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,TYPE_INT_VEC2,
                 in_stack_fffffffffffffd78,in_stack_fffffffffffffd80);
      std::__cxx11::string::string((string *)&local_f0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x38,FUNCTION_TEXTURE_GATHER_OFFSET_MODE_LAST|
                       FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,TYPE_INT,in_stack_fffffffffffffd78,
                 in_stack_fffffffffffffd80);
      std::__cxx11::string::string((string *)&local_110,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x38,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_INT,in_stack_fffffffffffffd78
                );
      std::__cxx11::string::string((string *)&local_130,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x38,TYPE_FLOAT_VEC3,TYPE_INT,TYPE_INT,in_stack_fffffffffffffd78
                );
      std::__cxx11::string::string((string *)&local_150,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x38,TYPE_FLOAT_VEC3,TYPE_INT,TYPE_FLOAT,
                 in_stack_fffffffffffffd78);
      std::__cxx11::string::string((string *)&local_170,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x3f,FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,TYPE_INT_VEC2,
                 in_stack_fffffffffffffd78,in_stack_fffffffffffffd80);
      std::__cxx11::string::string((string *)&local_190,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,0x3f,FUNCTION_TEXTURE_GATHER_OFFSET_MODE_LAST|
                       FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,TYPE_INT,in_stack_fffffffffffffd78,
                 in_stack_fffffffffffffd80);
      std::__cxx11::string::string((string *)&local_1b0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x3f,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_INT,in_stack_fffffffffffffd78
                );
      std::__cxx11::string::string((string *)&local_1d0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x3f,TYPE_FLOAT_VEC3,TYPE_INT,TYPE_INT,in_stack_fffffffffffffd78
                );
      std::__cxx11::string::string((string *)&local_1f0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x3f,TYPE_FLOAT_VEC3,TYPE_INT,TYPE_FLOAT,
                 in_stack_fffffffffffffd78);
      std::__cxx11::string::string((string *)&local_210,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_VERTEX,0x40,TYPE_FLOAT_VEC3,TYPE_INT_VEC2,TYPE_INT,
                 in_stack_fffffffffffffd78);
      std::__cxx11::string::string((string *)&local_230,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestContext::endSection(ctx);
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_gather_offset_sampler_2d_array (NegativeTestContext& ctx)
{
	ctx.beginSection("textureGatherOffset - sampler2DArray");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_INT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_2D_ARRAY, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP, glu::TYPE_UINT_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}